

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O2

void yyml::nn::SubstractBackward<double>
               (Variable<double> *va,Variable<double> *vb,Variable<double> *result)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  int i;
  ulong uVar4;
  Variable<double> *in_stack_00000008;
  
  uVar1 = (result->grads_).shape_.total;
  for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
    pdVar2 = (result->grads_).data_;
    pdVar3 = (va->grads_).data_;
    pdVar3[uVar4] = pdVar2[uVar4] + pdVar3[uVar4];
    pdVar3 = (vb->grads_).data_;
    pdVar3[uVar4] = pdVar3[uVar4] - pdVar2[uVar4];
  }
  Factory<yyml::nn::Variable<double>_>::RemoveInstance(in_stack_00000008);
  return;
}

Assistant:

void SubstractBackward(Variable<Type>* va, Variable<Type>* vb,
                       Variable<Type>* result) {
  for (int i = 0; i < result->grads_.total(); i++) {
    /* dL      dL      d(upper)          dL
     * -- = -------- * ----------- =  -------- * 1
     * dx   d(upper)      dx          d(upper)
     *
     */
    va->grads_.data_[i] += result->grads_.data_[i];
    vb->grads_.data_[i] -= result->grads_.data_[i];
  }
  Variable<Type>::factory::RemoveInstance(result);
}